

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

double Utils::CubicNorm(Matrix *m)

{
  int iVar1;
  int iVar2;
  int i;
  int i_00;
  int j;
  double dVar3;
  double dVar4;
  undefined8 local_20;
  
  i_00 = 0;
  dVar3 = 0.0;
  while( true ) {
    iVar1 = Matrix::GetRows(m);
    if (iVar1 <= i_00) break;
    iVar1 = 0;
    local_20 = 0.0;
    while( true ) {
      iVar2 = Matrix::GetCols(m);
      if (iVar2 <= iVar1) break;
      dVar4 = Matrix::operator()(m,i_00,iVar1);
      local_20 = local_20 + ABS(dVar4);
      iVar1 = iVar1 + 1;
    }
    if (local_20 <= dVar3) {
      local_20 = dVar3;
    }
    i_00 = i_00 + 1;
    dVar3 = local_20;
  }
  return dVar3;
}

Assistant:

double Utils::CubicNorm(const Matrix& m)
{
    double norm = 0;
    for (int i = 0; i < m.GetRows(); ++i)
    {
        double sum = 0;
        for (int j = 0; j < m.GetCols(); ++j)
        {
            sum += std::abs(m(i, j));
        }
        norm = std::max(norm, sum);
    }
    return norm;
}